

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O1

shared_ptr<Jupiter::IRC::Client::User> __thiscall
Jupiter::IRC::Client::findUserOrAdd(Client *this,string_view in_name)

{
  Socket *pSVar1;
  undefined8 uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  jessilib *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  char in_R8B;
  string_view in_nickname;
  shared_ptr<Jupiter::IRC::Client::User> sVar4;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::User>_>,_false,_false>,_bool>
  pVar5;
  shared_ptr<Jupiter::IRC::Client::User> user;
  shared_ptr<Jupiter::IRC::Client::User> result;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  name_split;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  username_hostname;
  undefined1 local_a8 [16];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  in_nickname._M_len = in_name._M_len;
  jessilib::split_once<std::__cxx11::string,char_const*,char_const*,char>
            (&local_98,in_RCX,in_name._M_str + (long)in_RCX,(char *)0x21,in_R8B);
  in_nickname._M_str = (char *)local_98.first._M_string_length;
  sVar4 = getUser((Client *)local_a8,in_nickname);
  uVar2 = local_a8._8_8_;
  _Var3 = sVar4.super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if ((_func_int **)local_a8._0_8_ == (_func_int **)0x0) {
    jessilib::
    split_once<std::__cxx11::string,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_58,(jessilib *)local_98.second._M_dataplus._M_p,
               (char *)(local_98.second._M_string_length + (long)local_98.second._M_dataplus._M_p),
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )0x40,in_R8B);
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x78);
    this_00->_M_use_count = 1;
    this_00->_M_weak_count = 1;
    this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00147560;
    this_00[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    this_00[1]._M_use_count = 0;
    this_00[1]._M_weak_count = 0;
    this_00[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    this_00[2]._M_use_count = 0;
    this_00[2]._M_weak_count = 0;
    this_00[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    this_00[3]._M_use_count = 0;
    this_00[3]._M_weak_count = 0;
    this_00[4]._vptr__Sp_counted_base = (_func_int **)0x0;
    this_00[4]._M_use_count = 0;
    this_00[4]._M_weak_count = 0;
    this_00[5]._vptr__Sp_counted_base = (_func_int **)0x0;
    this_00[5]._M_use_count = 0;
    this_00[5]._M_weak_count = 0;
    this_00[6]._vptr__Sp_counted_base = (_func_int **)0x0;
    this_00[6]._M_use_count = 0;
    this_00[6]._M_weak_count = 0;
    this_00[7]._vptr__Sp_counted_base = (_func_int **)0x0;
    *(_Atomic_word **)&this_00[1]._M_use_count = &this_00[2]._M_use_count;
    this_00[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    *(undefined1 *)&this_00[2]._M_use_count = 0;
    *(_Atomic_word **)&this_00[3]._M_use_count = &this_00[4]._M_use_count;
    this_00[4]._vptr__Sp_counted_base = (_func_int **)0x0;
    *(undefined1 *)&this_00[4]._M_use_count = 0;
    *(_Atomic_word **)&this_00[5]._M_use_count = &this_00[6]._M_use_count;
    this_00[6]._vptr__Sp_counted_base = (_func_int **)0x0;
    *(undefined1 *)&this_00[6]._M_use_count = 0;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &this_00[1]._M_use_count,&local_98.first);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &this_00[3]._M_use_count,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &this_00[5]._M_use_count,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38);
    pVar5 = std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<Jupiter::IRC::Client::User>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Jupiter::IRC::Client::User>>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<std::__cxx11::string&,std::shared_ptr<Jupiter::IRC::Client::User>&>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<Jupiter::IRC::Client::User>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Jupiter::IRC::Client::User>>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)(in_nickname._M_len + 0x278),&this_00[1]._M_use_count);
    _Var3._M_pi = pVar5._8_8_;
    (this->super_Thinker)._vptr_Thinker =
         *(_func_int ***)
          ((long)pVar5.first.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::User>_>,_false>
                 ._M_cur.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::User>_>,_false>
          + 0x28);
    pSVar1 = *(Socket **)
              ((long)pVar5.first.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::User>_>,_false>
                     ._M_cur.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::User>_>,_false>
              + 0x30);
    (this->m_socket)._M_t.
    super___uniq_ptr_impl<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>._M_t.
    super__Tuple_impl<0UL,_Jupiter::Socket_*,_std::default_delete<Jupiter::Socket>_>.
    super__Head_base<0UL,_Jupiter::Socket_*,_false>._M_head_impl = pSVar1;
    if (pSVar1 != (Socket *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&pSVar1->m_data = *(int *)&pSVar1->m_data + 1;
        UNLOCK();
      }
      else {
        *(int *)&pSVar1->m_data = *(int *)&pSVar1->m_data + 1;
      }
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      _Var3._M_pi = extraout_RDX;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_allocated_capacity != &local_28) {
      operator_delete((void *)local_38._M_allocated_capacity,
                      (ulong)(local_28._M_allocated_capacity + 1));
      _Var3._M_pi = extraout_RDX_00;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_allocated_capacity != &local_48) {
      operator_delete((void *)local_58._M_allocated_capacity,
                      (ulong)(local_48._M_allocated_capacity + 1));
      _Var3._M_pi = extraout_RDX_01;
    }
  }
  else {
    (this->super_Thinker)._vptr_Thinker = (_func_int **)local_a8._0_8_;
    (this->m_socket)._M_t.
    super___uniq_ptr_impl<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>._M_t.
    super__Tuple_impl<0UL,_Jupiter::Socket_*,_std::default_delete<Jupiter::Socket>_>.
    super__Head_base<0UL,_Jupiter::Socket_*,_false>._M_head_impl = (Socket *)0x0;
    local_a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->m_socket)._M_t.
    super___uniq_ptr_impl<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>._M_t.
    super__Tuple_impl<0UL,_Jupiter::Socket_*,_std::default_delete<Jupiter::Socket>_>.
    super__Head_base<0UL,_Jupiter::Socket_*,_false>._M_head_impl = (Socket *)uVar2;
    local_a8._0_8_ = (_func_int **)0x0;
  }
  if ((Socket *)local_a8._8_8_ != (Socket *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
    _Var3._M_pi = extraout_RDX_02;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.second._M_dataplus._M_p != &local_98.second.field_2) {
    operator_delete(local_98.second._M_dataplus._M_p,
                    local_98.second.field_2._M_allocated_capacity + 1);
    _Var3._M_pi = extraout_RDX_03;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.first._M_dataplus._M_p != &local_98.first.field_2) {
    operator_delete(local_98.first._M_dataplus._M_p,local_98.first.field_2._M_allocated_capacity + 1
                   );
    _Var3._M_pi = extraout_RDX_04;
  }
  sVar4.super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var3._M_pi;
  sVar4.super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Jupiter::IRC::Client::User>)
         sVar4.super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Jupiter::IRC::Client::User> Jupiter::IRC::Client::findUserOrAdd(std::string_view in_name) {
	// in_name: Nickname!Username@Hostname
	// Assume: Nickname can contain anything but !
	// Assume: Username can contain anything but @
	// Assume: Hostname can contain anything
	auto name_split = jessilib::split_once(in_name, '!');

	auto result = getUser(name_split.first);
	if (result != nullptr) {
		return result;
	}

	auto username_hostname = jessilib::split_once(name_split.second, '@');

	auto user = std::make_shared<User>();
	user->m_nickname = name_split.first;
	user->m_username = username_hostname.first;
	user->m_hostname = username_hostname.second;
	return m_users.emplace(user->m_nickname, user).first->second;
}